

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::small_vector
          (small_vector<pstore::command_line::literal,_3UL> *this,
          initializer_list<pstore::command_line::literal> init)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  value_type *__value;
  long lVar3;
  back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_> local_28;
  
  __n = init._M_len;
  __value = init._M_array;
  small_vector(this);
  uVar2 = ((long)(this->big_buffer_).
                 super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)(this->big_buffer_).
                 super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  uVar1 = 3;
  if (3 < uVar2) {
    uVar1 = uVar2;
  }
  if (uVar1 < __n) {
    std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
    reserve(&this->big_buffer_,__n);
  }
  if (0 < (long)__n) {
    lVar3 = __n + 1;
    local_28.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<pstore::command_line::literal,_3UL>_>::
      operator=(&local_28,__value);
      __value = __value + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (std::initializer_list<ElementType> init)
            : small_vector () {
        this->reserve (init.size ());
        std::copy (std::begin (init), std::end (init), std::back_inserter (*this));
    }